

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::decoder_etc_block::get_block_color5
               (color32 *base_color5,uint32_t inten_table,uint32_t index,uint32_t *r,uint32_t *g,
               uint32_t *b)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int *in_RCX;
  uint in_EDX;
  uint in_ESI;
  byte *in_RDI;
  int *in_R8;
  int *in_R9;
  int *pInten_table;
  uint32_t bb;
  uint32_t bg;
  uint32_t br;
  
  if (in_EDX < 4) {
    bVar1 = in_RDI[1];
    bVar2 = in_RDI[1];
    bVar3 = in_RDI[2];
    bVar4 = in_RDI[2];
    iVar5 = clamp255(((uint)*in_RDI << 3 | (int)(uint)*in_RDI >> 2) +
                     *(int *)(g_etc1_inten_tables + (ulong)in_EDX * 4 + (ulong)in_ESI * 0x10));
    *in_RCX = iVar5;
    iVar5 = clamp255(((uint)bVar1 << 3 | (int)(uint)bVar2 >> 2) +
                     *(int *)(g_etc1_inten_tables + (ulong)in_EDX * 4 + (ulong)in_ESI * 0x10));
    *in_R8 = iVar5;
    iVar5 = clamp255(((uint)bVar3 << 3 | (int)(uint)bVar4 >> 2) +
                     *(int *)(g_etc1_inten_tables + (ulong)in_EDX * 4 + (ulong)in_ESI * 0x10));
    *in_R9 = iVar5;
    return;
  }
  __assert_fail("index < 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0x33d,
                "static void basist::decoder_etc_block::get_block_color5(const color32 &, uint32_t, uint32_t, uint32_t &, uint32_t &, uint32_t &)"
               );
}

Assistant:

static void get_block_color5(const color32& base_color5, uint32_t inten_table, uint32_t index, uint32_t& r, uint32_t &g, uint32_t &b)
		{
			assert(index < 4);

			uint32_t br = (base_color5.r << 3) | (base_color5.r >> 2);
			uint32_t bg = (base_color5.g << 3) | (base_color5.g >> 2);
			uint32_t bb = (base_color5.b << 3) | (base_color5.b >> 2);

			const int* pInten_table = g_etc1_inten_tables[inten_table];

			r = clamp255(br + pInten_table[index]);
			g = clamp255(bg + pInten_table[index]);
			b = clamp255(bb + pInten_table[index]);
		}